

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

uchar * glfwGetJoystickHats(int jid,int *count)

{
  GLFWbool GVar1;
  long lVar2;
  _GLFWjoystick *js;
  int *count_local;
  uchar *puStack_10;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x462,"const unsigned char *glfwGetJoystickHats(int, int *)");
  }
  if (jid < 0x10) {
    if (count != (int *)0x0) {
      *count = 0;
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
        puStack_10 = (uchar *)0x0;
      }
      else if ((jid < 0) || (0xf < jid)) {
        _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
        puStack_10 = (uchar *)0x0;
      }
      else {
        GVar1 = initJoysticks();
        if (GVar1 == 0) {
          puStack_10 = (uchar *)0x0;
        }
        else {
          lVar2 = (long)jid;
          if (_glfw.joysticks[lVar2].connected == 0) {
            puStack_10 = (uchar *)0x0;
          }
          else {
            GVar1 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(lVar2 * 0x2018 + 0x1eba88),2);
            if (GVar1 == 0) {
              puStack_10 = (uchar *)0x0;
            }
            else {
              *count = _glfw.joysticks[lVar2].hatCount;
              puStack_10 = _glfw.joysticks[lVar2].hats;
            }
          }
        }
      }
      return puStack_10;
    }
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x464,"const unsigned char *glfwGetJoystickHats(int, int *)");
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                ,0x463,"const unsigned char *glfwGetJoystickHats(int, int *)");
}

Assistant:

char* glfwGetJoystickHats(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->connected)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    *count = js->hatCount;
    return js->hats;
}